

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O1

_Bool rtr_mgr_conf_in_sync(rtr_mgr_config *config)

{
  pthread_rwlock_t *__rwlock;
  long lVar1;
  long *plVar2;
  bool bVar3;
  tommy_list ptVar4;
  ulong uVar5;
  tommy_list ptVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __rwlock = &config->mutex;
  pthread_rwlock_rdlock((pthread_rwlock_t *)__rwlock);
  ptVar6 = config->groups->list;
  do {
    ptVar4 = ptVar6;
    if (ptVar4 == (tommy_list)0x0) {
      pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
      break;
    }
    plVar2 = *(long **)((long)ptVar4->data + 0x20);
    uVar5 = (ulong)*(uint *)(plVar2 + 1);
    if (uVar5 == 0) {
      bVar3 = true;
    }
    else {
      bVar3 = true;
      uVar7 = 0;
      do {
        if (*(long *)(*(long *)(*plVar2 + uVar7 * 8) + 0x10) == 0) {
          bVar3 = false;
        }
        if (!bVar3) {
          ptVar6 = ptVar4->next;
          goto LAB_00106138;
        }
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    ptVar6 = ptVar4;
LAB_00106138:
  } while (!bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return ptVar4 != (tommy_list)0x0;
}

Assistant:

RTRLIB_EXPORT bool rtr_mgr_conf_in_sync(struct rtr_mgr_config *config)
{
	pthread_rwlock_rdlock(&config->mutex);
	tommy_node *node = tommy_list_head(&config->groups->list);

	while (node) {
		bool all_sync = true;
		struct rtr_mgr_group_node *group_node = node->data;

		for (unsigned int j = 0; all_sync && (j < group_node->group->sockets_len); j++) {
			if (group_node->group->sockets[j]->last_update == 0)
				all_sync = false;
		}
		if (all_sync) {
			pthread_rwlock_unlock(&config->mutex);
			return true;
		}
		node = node->next;
	}
	pthread_rwlock_unlock(&config->mutex);
	return false;
}